

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ErrorsReportedToLogError_Test::TestBody
          (ValidationErrorTest_ErrorsReportedToLogError_Test *this)

{
  bool bVar1;
  char *pcVar2;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pMVar3;
  FileDescriptor *pFVar4;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string local_3f0;
  AssertHelper local_3d0;
  Message local_3c8;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__1;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_3a0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_388;
  Matcher<absl::lts_20250127::LogSeverity> local_370;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_358;
  WithoutMatchers local_301;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_300;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2e8;
  Matcher<absl::lts_20250127::LogSeverity> local_2d0;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2b8;
  undefined1 local_268 [8];
  ScopedMockLog log;
  string local_170;
  AssertHelper local_150;
  Message local_148 [3];
  basic_string_view<char,_std::char_traits<char>_> local_130;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file_proto;
  ValidationErrorTest_ErrorsReportedToLogError_Test *this_local;
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,
             "name: \"foo.proto\" message_type { name: \"Foo\" } message_type { name: \"Foo\" } ");
  input._M_str = (char *)&gtest_ar_.message_;
  input._M_len = (size_t)local_130._M_str;
  local_119 = TextFormat::ParseFromString((TextFormat *)local_130._M_len,input,in_RCX);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_118,
               (AssertionResult *)
               "TextFormat::ParseFromString(\"name: \\\"foo.proto\\\" \" \"message_type { name: \\\"Foo\\\" } \" \"message_type { name: \\\"Foo\\\" } \", &file_proto)"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(local_148);
  }
  log._237_3_ = 0;
  log._236_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  if (log._236_4_ == 0) {
    absl::lts_20250127::ScopedMockLog::ScopedMockLog((ScopedMockLog *)local_268,kDisallowUnexpected)
    ;
    testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher(&local_2d0,kError);
    testing::Matcher<std::__cxx11::string_const&>::
    Matcher<testing::internal::AnythingMatcher_const&,void>
              ((Matcher<std::__cxx11::string_const&> *)&local_2e8,(AnythingMatcher *)&testing::_);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher(&local_300,"Invalid proto descriptor for file \"foo.proto\":");
    absl::lts_20250127::ScopedMockLog::gmock_Log
              (&local_2b8,(ScopedMockLog *)local_268,&local_2d0,&local_2e8,&local_300);
    testing::internal::GetWithoutMatchers();
    pMVar3 = testing::internal::
             MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(&local_2b8,&local_301,(void *)0x0);
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::InternalExpectedAt
              (pMVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4b,"log",
               "Log(absl::LogSeverity::kError, testing::_, \"Invalid proto descriptor for file \\\"foo.proto\\\":\")"
              );
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~MockSpec(&local_2b8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_300);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_2e8);
    testing::Matcher<absl::lts_20250127::LogSeverity>::~Matcher(&local_2d0);
    testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher(&local_370,kError);
    testing::Matcher<std::__cxx11::string_const&>::
    Matcher<testing::internal::AnythingMatcher_const&,void>
              ((Matcher<std::__cxx11::string_const&> *)&local_388,(AnythingMatcher *)&testing::_);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher(&local_3a0,"  Foo: \"Foo\" is already defined.");
    absl::lts_20250127::ScopedMockLog::gmock_Log
              (&local_358,(ScopedMockLog *)local_268,&local_370,&local_388,&local_3a0);
    testing::internal::GetWithoutMatchers();
    pMVar3 = testing::internal::
             MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(&local_358,
                          (WithoutMatchers *)
                          ((long)&gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 7),(void *)0x0);
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::InternalExpectedAt
              (pMVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4d,"log",
               "Log(absl::LogSeverity::kError, testing::_, \"  Foo: \\\"Foo\\\" is already defined.\")"
              );
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~MockSpec(&local_358);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_3a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_388);
    testing::Matcher<absl::lts_20250127::LogSeverity>::~Matcher(&local_370);
    absl::lts_20250127::ScopedMockLog::StartCapturingLogs((ScopedMockLog *)local_268);
    pFVar4 = DescriptorPool::BuildFile
                       (&(this->super_ValidationErrorTest).pool_,
                        (FileDescriptorProto *)&gtest_ar_.message_);
    local_3b9 = pFVar4 == (FileDescriptor *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3f0,(internal *)local_3b8,
                 (AssertionResult *)"pool_.BuildFile(file_proto) == nullptr","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1b4f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      testing::Message::~Message(&local_3c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
    absl::lts_20250127::ScopedMockLog::~ScopedMockLog((ScopedMockLog *)local_268);
    log._236_4_ = 0;
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ErrorsReportedToLogError) {
  // Test that errors are reported to ABSL_LOG(ERROR) if no error collector is
  // provided.

  FileDescriptorProto file_proto;
  ASSERT_TRUE(
      TextFormat::ParseFromString("name: \"foo.proto\" "
                                  "message_type { name: \"Foo\" } "
                                  "message_type { name: \"Foo\" } ",
                                  &file_proto));
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "Invalid proto descriptor for file \"foo.proto\":"));
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "  Foo: \"Foo\" is already defined."));
    log.StartCapturingLogs();
    EXPECT_TRUE(pool_.BuildFile(file_proto) == nullptr);
  }
}